

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketabstraction_p.h
# Opt level: O0

SocketError QSocketAbstraction::socketError(QIODevice *device)

{
  long lVar1;
  SocketError SVar2;
  anon_class_1_0_00000001 *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getError;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = visit<QSocketAbstraction::socketError(QIODevice*)::_lambda(auto:1*)_1_&>
                    (in_RDI,(QIODevice *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline QAbstractSocket::SocketError socketError(QIODevice *device)
{
    auto getError = [](auto *s) {
        using T = std::remove_pointer_t<decltype(s)>;
        if constexpr (std::is_same_v<T, QAbstractSocket>) {
            return s->error();
#if QT_CONFIG(localserver)
        } else if constexpr (std::is_same_v<T, QLocalSocket>) {
            QLocalSocket::LocalSocketError st = s->error();
            return static_cast<QAbstractSocket::SocketError>(st);
#endif
        }
        Q_UNREACHABLE();
    };
    return visit(getError, device);
}